

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiAnimMesh **_dest,aiAnimMesh *src)

{
  bool bVar1;
  aiAnimMesh *this;
  uint local_24;
  uint n;
  aiAnimMesh *dest;
  aiAnimMesh *src_local;
  aiAnimMesh **_dest_local;
  
  if ((_dest != (aiAnimMesh **)0x0) && (src != (aiAnimMesh *)0x0)) {
    this = (aiAnimMesh *)operator_new(0x4b0);
    aiAnimMesh::aiAnimMesh(this);
    *_dest = this;
    memcpy(this,src,0x4b0);
    GetArrayCopy<aiVector3t<float>>(&this->mVertices,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mNormals,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mTangents,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mBitangents,this->mNumVertices);
    local_24 = 0;
    while (bVar1 = aiAnimMesh::HasTextureCoords(this,local_24), bVar1) {
      GetArrayCopy<aiVector3t<float>>(this->mTextureCoords + local_24,this->mNumVertices);
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    while (bVar1 = aiAnimMesh::HasVertexColors(this,local_24), bVar1) {
      GetArrayCopy<aiColor4t<float>>(this->mColors + local_24,this->mNumVertices);
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiAnimMesh** _dest, const aiAnimMesh* src) {
    if (nullptr == _dest || nullptr == src) {
        return;
    }

    aiAnimMesh* dest = *_dest = new aiAnimMesh();

    // get a flat copy
    ::memcpy(dest, src, sizeof(aiAnimMesh));

    // and reallocate all arrays
    GetArrayCopy(dest->mVertices, dest->mNumVertices);
    GetArrayCopy(dest->mNormals, dest->mNumVertices);
    GetArrayCopy(dest->mTangents, dest->mNumVertices);
    GetArrayCopy(dest->mBitangents, dest->mNumVertices);

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy(dest->mTextureCoords[n++], dest->mNumVertices);

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy(dest->mColors[n++], dest->mNumVertices);
}